

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Value * __thiscall toml::Value::push(Value *this,Value *v)

{
  Array local_48;
  Value local_28;
  
  if (this->type_ != ARRAY_TYPE) {
    if (this->type_ != NULL_TYPE) {
      failwith<char_const(&)[38]>((char (*) [38])"type must be array to do push(Value).");
    }
    local_48.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value(&local_28,&local_48);
    operator=(this,&local_28);
    ~Value(&local_28);
    std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector(&local_48);
  }
  std::vector<toml::Value,_std::allocator<toml::Value>_>::emplace_back<toml::Value>
            ((vector<toml::Value,_std::allocator<toml::Value>_> *)(this->field_1).string_,v);
  return (Value *)(((this->field_1).string_)->_M_string_length - 0x10);
}

Assistant:

inline Value* Value::push(Value&& v)
{
    if (!valid())
        *this = Value((Array()));
    else if (!is<Array>())
        failwith("type must be array to do push(Value).");

    array_->push_back(std::move(v));
    return &array_->back();
}